

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderCompilationCases.cpp
# Opt level: O2

float deqp::gles3::Performance::vectorFloatRelativeStandardDeviation<long>
                (vector<long,_std::allocator<long>_> *v)

{
  float fVar1;
  float fVar2;
  
  fVar1 = vectorFloatStandardDeviation<long>(v);
  fVar2 = vectorFloatAverage<long>(v);
  return (float)(~-(uint)(fVar2 == 0.0) & (uint)(fVar1 / fVar2));
}

Assistant:

static float vectorFloatRelativeStandardDeviation (const vector<T>& v)
{
	return hackySafeRelativeResult(vectorFloatStandardDeviation(v), vectorFloatAverage(v));
}